

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O3

bool cmCacheManager::ParseEntry(string *entry,string *var,string *value,CacheEntryType *type)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  CacheEntryType CVar4;
  int iVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  char *local_48;
  undefined8 local_40;
  char local_38;
  undefined7 uStack_37;
  
  if ((ParseEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmState::CacheEntryType&)
       ::reg == '\0') &&
     (iVar5 = __cxa_guard_acquire(&ParseEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmState::CacheEntryType&)
                                   ::reg), iVar5 != 0)) {
    ParseEntry::reg.program = (char *)0x0;
    cmsys::RegularExpression::compile
              (&ParseEntry::reg,"^([^=:]*):([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ParseEntry::reg,&__dso_handle);
    __cxa_guard_release(&ParseEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmState::CacheEntryType&)
                         ::reg);
  }
  if ((ParseEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmState::CacheEntryType&)
       ::regQuoted == '\0') &&
     (iVar5 = __cxa_guard_acquire(&ParseEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmState::CacheEntryType&)
                                   ::regQuoted), iVar5 != 0)) {
    ParseEntry::regQuoted.program = (char *)0x0;
    cmsys::RegularExpression::compile
              (&ParseEntry::regQuoted,"^\"([^\"]*)\":([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ParseEntry::regQuoted,&__dso_handle);
    __cxa_guard_release(&ParseEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmState::CacheEntryType&)
                         ::regQuoted);
  }
  bVar3 = cmsys::RegularExpression::find(&ParseEntry::regQuoted,(entry->_M_dataplus)._M_p);
  if (bVar3) {
    if (ParseEntry::regQuoted.startp[1] == (char *)0x0) {
      local_48 = &local_38;
      local_40 = 0;
      local_38 = '\0';
    }
    else {
      local_48 = &local_38;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,ParseEntry::regQuoted.startp[1],ParseEntry::regQuoted.endp[1]);
    }
    std::__cxx11::string::operator=((string *)var,(string *)&local_48);
    if (local_48 != &local_38) {
      operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
    }
    local_48 = &local_38;
    if (ParseEntry::regQuoted.startp[2] == (char *)0x0) {
      local_40 = 0;
      local_38 = '\0';
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,ParseEntry::regQuoted.startp[2],ParseEntry::regQuoted.endp[2]);
    }
    CVar4 = cmState::StringToCacheEntryType(local_48);
    *type = CVar4;
    pcVar1 = ParseEntry::regQuoted.startp[3];
    pcVar2 = ParseEntry::regQuoted.endp[3];
    if (local_48 != &local_38) {
      operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
      pcVar1 = ParseEntry::regQuoted.startp[3];
      pcVar2 = ParseEntry::regQuoted.endp[3];
    }
joined_r0x00385c88:
    if (pcVar1 == (char *)0x0) {
      local_48 = &local_38;
      local_40 = 0;
      local_38 = '\0';
    }
    else {
      local_48 = &local_38;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,pcVar1,pcVar2);
    }
    std::__cxx11::string::operator=((string *)value,(string *)&local_48);
    if (local_48 == &local_38) goto LAB_00385cd3;
  }
  else {
    bVar3 = cmsys::RegularExpression::find(&ParseEntry::reg,(entry->_M_dataplus)._M_p);
    if (bVar3) {
      if (ParseEntry::reg.startp[1] == (char *)0x0) {
        local_48 = &local_38;
        local_40 = 0;
        local_38 = '\0';
      }
      else {
        local_48 = &local_38;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,ParseEntry::reg.startp[1],ParseEntry::reg.endp[1]);
      }
      std::__cxx11::string::operator=((string *)var,(string *)&local_48);
      if (local_48 != &local_38) {
        operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
      }
      local_48 = &local_38;
      if (ParseEntry::reg.startp[2] == (char *)0x0) {
        local_40 = 0;
        local_38 = '\0';
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,ParseEntry::reg.startp[2],ParseEntry::reg.endp[2]);
      }
      CVar4 = cmState::StringToCacheEntryType(local_48);
      *type = CVar4;
      pcVar1 = ParseEntry::reg.startp[3];
      pcVar2 = ParseEntry::reg.endp[3];
      if (local_48 != &local_38) {
        operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
        pcVar1 = ParseEntry::reg.startp[3];
        pcVar2 = ParseEntry::reg.endp[3];
      }
      goto joined_r0x00385c88;
    }
    if ((ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
         ::reg == '\0') &&
       (iVar5 = __cxa_guard_acquire(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                                     ::reg), iVar5 != 0)) {
      ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
      ::reg._184_8_ = 0;
      cmsys::RegularExpression::compile
                ((RegularExpression *)
                 ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                 ::reg,"^([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                   ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                   ::reg,&__dso_handle);
      __cxa_guard_release(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                           ::reg);
    }
    if ((ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
         ::regQuoted == '\0') &&
       (iVar5 = __cxa_guard_acquire(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                                     ::regQuoted), iVar5 != 0)) {
      ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
      ::regQuoted._184_8_ = 0;
      cmsys::RegularExpression::compile
                ((RegularExpression *)
                 ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                 ::regQuoted,"^\"([^\"]*)\"=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                   ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                   ::regQuoted,&__dso_handle);
      __cxa_guard_release(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                           ::regQuoted);
    }
    bVar3 = cmsys::RegularExpression::find
                      ((RegularExpression *)
                       ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                       ::regQuoted,(entry->_M_dataplus)._M_p);
    if (bVar3) {
      if (ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
          ::regQuoted._8_8_ == 0) {
        local_48 = &local_38;
        local_40 = 0;
        local_38 = '\0';
      }
      else {
        local_48 = &local_38;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,
                   ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                   ::regQuoted._8_8_,
                   ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                   ::regQuoted._88_8_);
      }
      std::__cxx11::string::operator=((string *)var,(string *)&local_48);
      if (local_48 != &local_38) {
        operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
      }
      uVar6 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
              ::regQuoted._96_8_;
      uVar7 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
              ::regQuoted._16_8_;
      if (ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
          ::regQuoted._16_8_ != 0) goto LAB_00385dde;
LAB_00385deb:
      local_48 = &local_38;
      local_40 = 0;
      local_38 = '\0';
    }
    else {
      bVar3 = cmsys::RegularExpression::find
                        ((RegularExpression *)
                         ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                         ::reg,(entry->_M_dataplus)._M_p);
      if (!bVar3) {
        return false;
      }
      if (ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
          ::reg._8_8_ == 0) {
        local_48 = &local_38;
        local_40 = 0;
        local_38 = '\0';
      }
      else {
        local_48 = &local_38;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,
                   ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                   ::reg._8_8_,
                   ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                   ::reg._88_8_);
      }
      std::__cxx11::string::operator=((string *)var,(string *)&local_48);
      if (local_48 != &local_38) {
        operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
      }
      uVar6 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
              ::reg._96_8_;
      uVar7 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
              ::reg._16_8_;
      if (ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
          ::reg._16_8_ == 0) goto LAB_00385deb;
LAB_00385dde:
      local_48 = &local_38;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,uVar7,uVar6);
    }
    std::__cxx11::string::operator=((string *)value,(string *)&local_48);
    if (local_48 == &local_38) goto LAB_00385cd3;
  }
  operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
LAB_00385cd3:
  if (((1 < value->_M_string_length) && (pcVar1 = (value->_M_dataplus)._M_p, *pcVar1 == '\'')) &&
     (pcVar1[value->_M_string_length - 1] == '\'')) {
    std::__cxx11::string::substr((ulong)&local_48,(ulong)value);
    std::__cxx11::string::operator=((string *)value,(string *)&local_48);
    if (local_48 != &local_38) {
      operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
    }
  }
  return true;
}

Assistant:

bool cmCacheManager::ParseEntry(const std::string& entry,
                                std::string& var,
                                std::string& value,
                                cmState::CacheEntryType& type)
{
  // input line is:         key:type=value
  static cmsys::RegularExpression reg(
    "^([^=:]*):([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
  // input line is:         "key":type=value
  static cmsys::RegularExpression regQuoted(
    "^\"([^\"]*)\":([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
  bool flag = false;
  if(regQuoted.find(entry))
    {
    var = regQuoted.match(1);
    type = cmState::StringToCacheEntryType(regQuoted.match(2).c_str());
    value = regQuoted.match(3);
    flag = true;
    }
  else if (reg.find(entry))
    {
    var = reg.match(1);
    type = cmState::StringToCacheEntryType(reg.match(2).c_str());
    value = reg.match(3);
    flag = true;
    }

  // if value is enclosed in single quotes ('foo') then remove them
  // it is used to enclose trailing space or tab
  if (flag &&
      value.size() >= 2 &&
      value[0] == '\'' &&
      value[value.size() - 1] == '\'')
    {
    value = value.substr(1,
                         value.size() - 2);
    }

  if (!flag)
    {
    return ParseEntryWithoutType(entry, var, value);
    }

  return flag;
}